

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkincludes.cpp
# Opt level: O0

int __thiscall MlmWrap::sendStream(MlmWrap *this,char *subject,char *picture,__va_list_tag *argptr)

{
  int iVar1;
  undefined8 in_RCX;
  char *in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  lock_guard<std::mutex> lock;
  zmsg_t *msg;
  zmsg_t *body;
  int rc;
  mutex_type *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  uint3 in_stack_ffffffffffffffa4;
  uint uVar2;
  zmsg_t *local_38;
  zmsg_t *local_30;
  int local_24;
  char *local_18;
  undefined8 local_10;
  
  local_24 = 0xffffffff;
  uVar2 = (uint)in_stack_ffffffffffffffa4;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_30 = czhelp_zmsg_create(in_RDX,in_RCX);
  local_38 = czhelp_zmsg_create("sssm","STR",local_10,local_18,local_30);
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)CONCAT44(uVar2,in_stack_ffffffffffffffa0),
             in_stack_ffffffffffffff98);
  iVar1 = zactor_send(*(zactor_t **)(in_RDI + 0x40),&local_38);
  local_24 = iVar1;
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x36efeb);
  return iVar1;
}

Assistant:

int MlmWrap::sendStream(const char* subject, const char* picture, va_list argptr) {
    int rc = -1;
//    std::cerr << error("sending out stream ") << subject << "\n";
    zmsg_t *body = czhelp_zmsg_create(picture, argptr);
    zmsg_t *msg = czhelp_zmsg_create("sssm", streammsg, subject, picture, body);
    //actual message structure - sssm -- note that the first three strings constitute the header, and the msg the body
    std::lock_guard<std::mutex> lock(actormutex);
    rc = zactor_send(actor, &msg);
    return rc;
}